

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widget.cpp
# Opt level: O3

void __thiscall polyscope::Widget::~Widget(Widget *this)

{
  _Base_ptr p_Var1;
  const_iterator __position;
  
  this->_vptr_Widget = (_func_int **)&PTR_draw_004b6798;
  if (state::widgets._16_8_ != 0) {
    __position._M_node = (_Base_ptr)(state::widgets + 8);
    p_Var1 = (_Base_ptr)state::widgets._16_8_;
    do {
      if (*(Widget **)(p_Var1 + 1) >= this) {
        __position._M_node = p_Var1;
      }
      p_Var1 = (&p_Var1->_M_left)[*(Widget **)(p_Var1 + 1) < this];
    } while (p_Var1 != (_Base_ptr)0x0);
    if ((__position._M_node != (_Base_ptr)(state::widgets + 8)) &&
       (*(Widget **)(__position._M_node + 1) <= this)) {
      std::
      _Rb_tree<polyscope::Widget*,polyscope::Widget*,std::_Identity<polyscope::Widget*>,std::less<polyscope::Widget*>,std::allocator<polyscope::Widget*>>
      ::erase_abi_cxx11_((_Rb_tree<polyscope::Widget*,polyscope::Widget*,std::_Identity<polyscope::Widget*>,std::less<polyscope::Widget*>,std::allocator<polyscope::Widget*>>
                          *)state::widgets,__position);
    }
  }
  return;
}

Assistant:

Widget::~Widget() {
  auto pos = state::widgets.find(this);
  if (pos == state::widgets.end()) return;
  state::widgets.erase(pos);
}